

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::write_exponent<char,char*>(int exp,char *it)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (exp + 9999U < 19999) {
    pcVar2 = it + 1;
    uVar3 = (ulong)(uint)-exp;
    if (0 < exp) {
      uVar3 = (ulong)(uint)exp;
    }
    *it = (char)(exp >> 0x1f) * -2 + '+';
    if (99 < (uint)uVar3) {
      uVar1 = (ulong)(ushort)((ushort)uVar3 / 100);
      if (999 < (uint)uVar3) {
        it[1] = basic_data<void>::digits[uVar1 * 2];
        pcVar2 = it + 2;
      }
      uVar3 = (ulong)(ushort)((ushort)uVar3 % 100);
      *pcVar2 = basic_data<void>::digits[uVar1 * 2 + 1];
      pcVar2 = pcVar2 + 1;
    }
    *(undefined2 *)pcVar2 = *(undefined2 *)(basic_data<void>::digits + uVar3 * 2);
    return pcVar2 + 2;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format.h"
              ,0x514,"exponent out of range");
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}